

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<bool> __thiscall kj::HttpServer::Connection::startLoop(Connection *this)

{
  Coroutine<bool> *this_00;
  Connection *this_01;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr__;
  SourceLocation location;
  bool bVar1;
  LoopResult LVar2;
  coroutine_handle<void> handle;
  Fault f;
  DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
  _kjCondition;
  Fault local_60;
  undefined1 local_58 [16];
  char *local_48;
  size_t local_40;
  bool local_38;
  
  handle._M_fr_ptr = operator_new(0x400);
  *(code **)handle._M_fr_ptr = startLoop;
  *(code **)((long)handle._M_fr_ptr + 8) = startLoop;
  this_00 = (Coroutine<bool> *)((long)handle._M_fr_ptr + 0x10);
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_58._8_8_ = "startLoop";
  local_48 = (char *)0x1500001cea;
  location.function = "startLoop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1cea;
  location.columnNumber = 0x15;
  kj::_::Coroutine<bool>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<bool>::get_return_object((Coroutine<bool> *)this);
  this_01 = (Connection *)((long)handle._M_fr_ptr + 0x3f0);
  startLoopImpl(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x238);
  co_await<kj::HttpServer::Connection::LoopResult>
            (__return_storage_ptr__,(Promise<kj::HttpServer::Connection::LoopResult> *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x3fc) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    LVar2 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                      (__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
              (__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    local_58._0_8_ = (long)handle._M_fr_ptr + 0x3f8;
    *(LoopResult *)local_58._0_8_ = LVar2;
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    local_48 = anon_var_dwarf_43885;
    local_40 = 5;
    local_38 = LVar2 != CONTINUE_LOOP;
    if (LVar2 == CONTINUE_LOOP) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::HttpServer::Connection::LoopResult&,kj::HttpServer::Connection::LoopResult>&>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x1cec,FAILED,"result != CONTINUE_LOOP","_kjCondition,",
                 (DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
                  *)local_58);
      kj::_::Debug::Fault::fatal(&local_60);
    }
    kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
              ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,LVar2 == BREAK_LOOP_CONN_OK);
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x3fc) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<bool> startLoop() {
    auto result = co_await startLoopImpl();
    KJ_ASSERT(result != CONTINUE_LOOP);
    co_return result == BREAK_LOOP_CONN_OK ? true : false;
  }